

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O3

c_v128 c_v128_unziphi_16(c_v128 a,c_v128 b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  c_v128 cVar5;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a.u64[1];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = b.u64[1];
  auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
  auVar1 = vpblendw_avx((undefined1  [16])0x0,auVar2,0x88);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = a.u64[0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = b.u64[0];
  auVar3 = vpunpcklqdq_avx(auVar4,auVar3);
  auVar2 = vpsllq_avx(auVar2,0x10);
  auVar4 = vpsrlq_avx(auVar3,0x20);
  auVar1 = vpor_avx(auVar4,auVar1);
  auVar3 = vpsrld_avx(auVar3,0x10);
  auVar1 = vpblendw_avx(auVar3,auVar1,0xaa);
  auVar1 = vpblendw_avx(auVar1,auVar2,0x44);
  cVar5._8_8_ = vpextrq_avx(auVar1,1);
  cVar5.u64[0] = auVar1._0_8_;
  return cVar5;
}

Assistant:

SIMD_INLINE c_v128 _c_v128_unzip_16(c_v128 a, c_v128 b, int mode) {
  c_v128 t;
  if (mode) {
    t.u16[7] = b.u16[7];
    t.u16[6] = b.u16[5];
    t.u16[5] = b.u16[3];
    t.u16[4] = b.u16[1];
    t.u16[3] = a.u16[7];
    t.u16[2] = a.u16[5];
    t.u16[1] = a.u16[3];
    t.u16[0] = a.u16[1];
  } else {
    t.u16[7] = a.u16[6];
    t.u16[6] = a.u16[4];
    t.u16[5] = a.u16[2];
    t.u16[4] = a.u16[0];
    t.u16[3] = b.u16[6];
    t.u16[2] = b.u16[4];
    t.u16[1] = b.u16[2];
    t.u16[0] = b.u16[0];
  }
  return t;
}